

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O0

void ON_qsort(void *base,size_t nel,size_t width,_func_int_void_ptr_void_ptr *compar)

{
  _func_int_void_ptr_void_ptr *compar_local;
  size_t width_local;
  size_t nel_local;
  void *base_local;
  
  qsort(base,nel,width,(__compar_fn_t)compar);
  return;
}

Assistant:

void 
ON_qsort( void *base, size_t nel, size_t width, int (*compar)(const void *, const void *))
{
#if defined(ON__HAVE_RELIABLE_SYSTEM_QSORT)
  // The call here must be a thread safe system qsort
  // that is faster than the alternative code in this function.
  // In particular, if it uses a random number generator to
  // find pivots, that calculation must be thread safe.
  qsort(base,nel,width,compar);
#else
  ON_hsort(base, nel, width, compar);
#endif
}